

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O3

QVariant * __thiscall
QAbstractSpinBox::inputMethodQuery
          (QVariant *__return_storage_ptr__,QAbstractSpinBox *this,InputMethodQuery query)

{
  QFlagsStorage<Qt::InputMethodHint> QVar1;
  uint uVar2;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_4_ = 0xaaaaaaaa;
  local_48._20_4_ = 0xaaaaaaaa;
  uStack_30 = 0xaaaaaaaa;
  uStack_2c = 0xaaaaaaaa;
  local_48._0_4_ = 0xaaaaaaaa;
  local_48._4_4_ = 0xaaaaaaaa;
  local_48._8_4_ = 0xaaaaaaaa;
  local_48._12_4_ = 0xaaaaaaaa;
  (**(code **)(**(long **)(*(long *)(this + 8) + 0x378) + 400))();
  if (query == ImHints) {
    QVar1.i = (Int)QWidget::inputMethodHints((QWidget *)this);
    if ((QFlagsStorage<Qt::InputMethodHint>)QVar1.i != (QFlagsStorage<Qt::InputMethodHint>)0x0) {
      uVar2 = ::QVariant::toInt((bool *)local_48.data);
      ::QVariant::QVariant(__return_storage_ptr__,QVar1.i | uVar2);
      goto LAB_00478d52;
    }
  }
  ::QVariant::QVariant(__return_storage_ptr__,(QVariant *)&local_48);
LAB_00478d52:
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QAbstractSpinBox::inputMethodQuery(Qt::InputMethodQuery query) const
{
    Q_D(const QAbstractSpinBox);
    const QVariant lineEditValue = d->edit->inputMethodQuery(query);
    switch (query) {
    case Qt::ImHints:
        if (const int hints = inputMethodHints())
            return QVariant(hints | lineEditValue.toInt());
        break;
    default:
        break;
    }
    return lineEditValue;
}